

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string_view<char,_std::char_traits<char>_> *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_e0;
  size_t local_a8;
  char *local_a0;
  cmAlphaNum local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_48;
  iterator local_30;
  undefined8 local_28;
  string_view *local_20;
  basic_string_view<char,_std::char_traits<char>_> *b_local;
  static_string_view *a_local;
  
  local_a8 = (a->super_string_view)._M_len;
  local_a0 = (a->super_string_view)._M_str;
  local_20 = b;
  b_local = &a->super_string_view;
  a_local = (static_string_view *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_98,a->super_string_view);
  cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_60,
             &cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_98);
  cmAlphaNum::cmAlphaNum(&local_e0,*local_20);
  cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_48,
             &cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_e0);
  local_30 = &local_60;
  local_28 = 2;
  views._M_len = 2;
  views._M_array = local_30;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}